

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastPush
          (Lowerer *this,Opnd *baseOpndParam,Opnd *src,Instr *callInstr,Instr *insertInstr,
          LabelInstr *labelHelper,LabelInstr *doneLabel,LabelInstr *bailOutLabelHelper,
          bool returnLength)

{
  code *pcVar1;
  undefined8 dst;
  bool bVar2;
  IRType IVar3;
  uint32 offset;
  undefined4 *puVar4;
  StackSym *pSVar5;
  StackSym *this_00;
  IndirOpnd *pIVar6;
  RegOpnd *this_01;
  Opnd *opnd_00;
  IndirOpnd *indirOpnd;
  bool isStringIndex;
  Instr *pIStack_e0;
  bool isTypedArrayElement;
  RegOpnd *opnd;
  IndirOpnd *local_d0;
  IndirOpnd *arrayRef;
  AutoReuseOpnd autoReuseArrayOpnd;
  ArrayRegOpnd *arrayRegOpnd;
  undefined1 local_a0 [8];
  AutoReuseOpnd autoReuseArrayLengthOpnd;
  RegOpnd *arrayLengthOpnd;
  RegOpnd *arrayOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_62;
  undefined1 local_60 [6];
  ValueType arrValueType;
  AutoReuseOpnd autoReuseBaseOpnd;
  RegOpnd *baseOpnd;
  bool returnLength_local;
  LabelInstr *labelHelper_local;
  Instr *insertInstr_local;
  Instr *callInstr_local;
  Opnd *src_local;
  Opnd *baseOpndParam_local;
  Lowerer *this_local;
  
  bVar2 = ShouldGenerateArrayFastPath(this,baseOpndParam,false,false,false);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x537a,"(ShouldGenerateArrayFastPath(baseOpndParam, false, false, false))",
                       "ShouldGenerateArrayFastPath(baseOpndParam, false, false, false)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  arrayLengthOpnd = IR::Opnd::AsRegOpnd(baseOpndParam);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_60,&arrayLengthOpnd->super_Opnd,this->m_func,true);
  local_62.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(baseOpndParam);
  autoReuseArrayLengthOpnd.autoDelete = false;
  autoReuseArrayLengthOpnd.wasInUse = false;
  autoReuseArrayLengthOpnd._18_6_ = 0;
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_a0);
  bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)&local_62.field_0);
  if (bVar2) {
    bVar2 = IR::RegOpnd::IsArrayRegOpnd(arrayLengthOpnd);
    if (bVar2) {
      autoReuseArrayOpnd._16_8_ = IR::RegOpnd::AsArrayRegOpnd(arrayLengthOpnd);
      pSVar5 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)autoReuseArrayOpnd._16_8_);
      if (pSVar5 != (StackSym *)0x0) {
        pSVar5 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)autoReuseArrayOpnd._16_8_);
        this_00 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)autoReuseArrayOpnd._16_8_);
        IVar3 = StackSym::GetType(this_00);
        autoReuseArrayLengthOpnd._16_8_ = IR::RegOpnd::New(pSVar5,IVar3,this->m_func);
        IR::RegOpnd::FreezeSymValue((RegOpnd *)autoReuseArrayLengthOpnd._16_8_);
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)local_a0,(Opnd *)autoReuseArrayLengthOpnd._16_8_,this->m_func,
                   true);
      }
    }
  }
  else {
    arrayLengthOpnd =
         GenerateArrayTest(this,arrayLengthOpnd,labelHelper,labelHelper,insertInstr,false,true,false
                          );
    arrayRegOpnd._2_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&arrayLengthOpnd->super_Opnd);
    arrayRegOpnd._4_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToDefiniteObject((ValueType *)((long)&arrayRegOpnd + 2));
    arrayRegOpnd._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)((long)&arrayRegOpnd + 4),false);
    local_62.field_0 = arrayRegOpnd._6_2_;
  }
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&arrayRef,&arrayLengthOpnd->super_Opnd,this->m_func,true);
  if (autoReuseArrayLengthOpnd._16_8_ == 0) {
    autoReuseArrayLengthOpnd._16_8_ = IR::RegOpnd::New(TyUint32,this->m_func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)local_a0,(Opnd *)autoReuseArrayLengthOpnd._16_8_,this->m_func,true);
    dst = autoReuseArrayLengthOpnd._16_8_;
    offset = Js::ArrayObject::GetOffsetOfLength();
    IVar3 = IR::Opnd::GetType((Opnd *)autoReuseArrayLengthOpnd._16_8_);
    pIVar6 = IR::IndirOpnd::New(arrayLengthOpnd,offset,IVar3,this->m_func,false);
    InsertMove((Opnd *)dst,&pIVar6->super_Opnd,insertInstr,true);
  }
  local_d0 = IR::IndirOpnd::New(arrayLengthOpnd,(RegOpnd *)autoReuseArrayLengthOpnd._16_8_,TyVar,
                                this->m_func);
  this_01 = IR::IndirOpnd::GetBaseOpnd(local_d0);
  opnd._6_2_ = local_62.field_0;
  IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)local_62.field_0);
  callInstr_local = (Instr *)src;
  if (returnLength) {
    opnd_00 = IR::Instr::GetDst(insertInstr);
    bVar2 = IR::Opnd::IsEqual(src,opnd_00);
    if (bVar2) {
      IVar3 = IR::Opnd::GetType(src);
      pIStack_e0 = (Instr *)IR::RegOpnd::New(IVar3,this->m_func);
      InsertMove((Opnd *)pIStack_e0,src,insertInstr,true);
      callInstr_local = pIStack_e0;
    }
  }
  pIVar6 = GenerateFastElemICommon
                     (this,insertInstr,true,local_d0,labelHelper,labelHelper,(LabelInstr *)0x0,
                      (bool *)((long)&indirOpnd + 7),(bool *)((long)&indirOpnd + 6),(bool *)0x0,
                      (Opnd **)0x0,(LabelInstr **)0x0,false,true,returnLength,bailOutLabelHelper,
                      (bool *)0x0,FldInfo_NoInfo);
  if ((indirOpnd._7_1_ & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x53c6,"(!isTypedArrayElement)","!isTypedArrayElement");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (pIVar6 == (IndirOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x53c7,"(indirOpnd)","indirOpnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  InsertMoveWithBarrier(&pIVar6->super_Opnd,(Opnd *)callInstr_local,insertInstr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&arrayRef);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_a0);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_60);
  return true;
}

Assistant:

bool Lowerer::GenerateFastPush(IR::Opnd *baseOpndParam, IR::Opnd *src, IR::Instr *callInstr,
    IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr *doneLabel, IR::LabelInstr * bailOutLabelHelper, bool returnLength)
{
    Assert(ShouldGenerateArrayFastPath(baseOpndParam, false, false, false));

    //     TEST baseOpnd, AtomTag                  -- check baseOpnd not tagged int
    //     JNE $helper
    //     CMP [baseOpnd], JavascriptArray::`vtable' -- check baseOpnd isArray
    //     JNE $helper
    //     MOV r2, [baseOpnd + offset(length)]     -- Load array length

    IR::RegOpnd *       baseOpnd = baseOpndParam->AsRegOpnd();
    const IR::AutoReuseOpnd autoReuseBaseOpnd(baseOpnd, m_func);

    ValueType arrValueType(baseOpndParam->GetValueType());
    IR::RegOpnd *arrayOpnd = baseOpnd;
    IR::RegOpnd *arrayLengthOpnd = nullptr;
    IR::AutoReuseOpnd autoReuseArrayLengthOpnd;
    if(!arrValueType.IsAnyOptimizedArray())
    {
        arrayOpnd = GenerateArrayTest(baseOpnd, labelHelper, labelHelper, insertInstr, false, true);
        arrValueType = arrayOpnd->GetValueType().ToDefiniteObject().SetHasNoMissingValues(false);
    }
    else if(arrayOpnd->IsArrayRegOpnd())
    {
        IR::ArrayRegOpnd *const arrayRegOpnd = arrayOpnd->AsArrayRegOpnd();
        if(arrayRegOpnd->LengthSym())
        {
            arrayLengthOpnd = IR::RegOpnd::New(arrayRegOpnd->LengthSym(), arrayRegOpnd->LengthSym()->GetType(), m_func);
            DebugOnly(arrayLengthOpnd->FreezeSymValue());
            autoReuseArrayLengthOpnd.Initialize(arrayLengthOpnd, m_func);
        }
    }
    const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, m_func);

    if(!arrayLengthOpnd)
    {
        //     MOV arrayLength, [array + offset(length)]     -- Load array length
        // We know this index is safe since, so mark it as UInt32 to avoid unnecessary conversion/checks
        arrayLengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
        autoReuseArrayLengthOpnd.Initialize(arrayLengthOpnd, m_func);
        InsertMove(
            arrayLengthOpnd,
            IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfLength(), arrayLengthOpnd->GetType(), this->m_func),
            insertInstr);
    }

    IR::IndirOpnd *arrayRef = IR::IndirOpnd::New(arrayOpnd, arrayLengthOpnd, TyVar, this->m_func);
    arrayRef->GetBaseOpnd()->SetValueType(arrValueType);

    if (returnLength && src->IsEqual(insertInstr->GetDst()))
    {
        //If the dst is same as the src, then dst is going to be overridden by GenerateFastElemICommon in process of updating the length.
        //Save it in a temp register.
        IR::RegOpnd *opnd = IR::RegOpnd::New(src->GetType(), this->m_func);
        InsertMove(opnd, src, insertInstr);
        src = opnd;
    }

    //Array length is going to overflow, hence don't check for Array.length and Segment.length overflow.
    bool isTypedArrayElement, isStringIndex;
    IR::IndirOpnd *const indirOpnd =
        GenerateFastElemICommon(
            insertInstr,
            true,
            arrayRef,
            labelHelper,
            labelHelper,
            nullptr,
            &isTypedArrayElement,
            &isStringIndex,
            nullptr,
            nullptr,
            nullptr /*pLabelSegmentLengthIncreased*/,
            false /*checkArrayLengthOverflow*/,
            true /* forceGenerateFastPath */,
            returnLength,
            bailOutLabelHelper);

    Assert(!isTypedArrayElement);
    Assert(indirOpnd);

    //  MOV [r3 + r2], src
    InsertMoveWithBarrier(indirOpnd, src, insertInstr);

    return true;
}